

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwDestroyWindow(GLFWwindow *handle)

{
  _GLFWwindow *p_Var1;
  _GLFWwindow *p_Var2;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (handle != (GLFWwindow *)0x0) {
    *(undefined8 *)(handle + 0x308) = 0;
    *(undefined8 *)(handle + 0x310) = 0;
    *(undefined8 *)(handle + 0x2f8) = 0;
    *(undefined8 *)(handle + 0x300) = 0;
    *(undefined8 *)(handle + 0x2e8) = 0;
    *(undefined8 *)(handle + 0x2f0) = 0;
    *(undefined8 *)(handle + 0x2d8) = 0;
    *(undefined8 *)(handle + 0x2e0) = 0;
    *(undefined8 *)(handle + 0x2c8) = 0;
    *(undefined8 *)(handle + 0x2d0) = 0;
    *(undefined8 *)(handle + 0x2b8) = 0;
    *(undefined8 *)(handle + 0x2c0) = 0;
    *(undefined8 *)(handle + 0x2a8) = 0;
    *(undefined8 *)(handle + 0x2b0) = 0;
    *(undefined8 *)(handle + 0x298) = 0;
    *(undefined8 *)(handle + 0x2a0) = 0;
    p_Var1 = _glfwPlatformGetCurrentContext();
    if (p_Var1 == (_GLFWwindow *)handle) {
      glfwMakeContextCurrent((GLFWwindow *)0x0);
    }
    _glfwPlatformDestroyWindow((_GLFWwindow *)handle);
    p_Var1 = (_GLFWwindow *)&_glfw.windowListHead;
    do {
      p_Var2 = p_Var1;
      p_Var1 = p_Var2->next;
    } while (p_Var1 != (_GLFWwindow *)handle);
    p_Var2->next = *(_GLFWwindow **)handle;
    free(handle);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwDestroyWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    // Allow closing of NULL (to match the behavior of free)
    if (window == NULL)
        return;

    // Clear all callbacks to avoid exposing a half torn-down window object
    memset(&window->callbacks, 0, sizeof(window->callbacks));

    // The window's context must not be current on another thread when the
    // window is destroyed
    if (window == _glfwPlatformGetCurrentContext())
        glfwMakeContextCurrent(NULL);

    _glfwPlatformDestroyWindow(window);

    // Unlink window from global linked list
    {
        _GLFWwindow** prev = &_glfw.windowListHead;

        while (*prev != window)
            prev = &((*prev)->next);

        *prev = window->next;
    }

    free(window);
}